

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::detach_shader(NegativeTestContext *ctx)

{
  NegativeTestContext *pNVar1;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  GLuint local_20;
  GLuint local_1c;
  GLuint notAProgram;
  GLuint notAShader;
  GLuint program;
  GLuint shader;
  NegativeTestContext *ctx_local;
  
  _program = ctx;
  notAShader = glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x8b31);
  notAProgram = glu::CallLogWrapper::glCreateProgram(&_program->super_CallLogWrapper);
  local_1c = glu::CallLogWrapper::glCreateShader(&_program->super_CallLogWrapper,0x8b31);
  local_20 = glu::CallLogWrapper::glCreateProgram(&_program->super_CallLogWrapper);
  glu::CallLogWrapper::glDeleteShader(&_program->super_CallLogWrapper,local_1c);
  glu::CallLogWrapper::glDeleteProgram(&_program->super_CallLogWrapper,local_20);
  pNVar1 = _program;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,
             "GL_INVALID_VALUE is generated if either program or shader is not a value generated by OpenGL."
             ,&local_41);
  NegativeTestContext::beginSection(pNVar1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  glu::CallLogWrapper::glDetachShader(&_program->super_CallLogWrapper,local_20,notAShader);
  NegativeTestContext::expectError(_program,0x501);
  glu::CallLogWrapper::glDetachShader(&_program->super_CallLogWrapper,notAProgram,local_1c);
  NegativeTestContext::expectError(_program,0x501);
  glu::CallLogWrapper::glDetachShader(&_program->super_CallLogWrapper,local_20,local_1c);
  NegativeTestContext::expectError(_program,0x501);
  NegativeTestContext::endSection(_program);
  pNVar1 = _program;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "GL_INVALID_OPERATION is generated if program is not a program object.",&local_79);
  NegativeTestContext::beginSection(pNVar1,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  glu::CallLogWrapper::glDetachShader(&_program->super_CallLogWrapper,notAShader,notAShader);
  NegativeTestContext::expectError(_program,0x502);
  NegativeTestContext::endSection(_program);
  pNVar1 = _program;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,
             "GL_INVALID_OPERATION is generated if shader is not a shader object.",&local_a1);
  NegativeTestContext::beginSection(pNVar1,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  glu::CallLogWrapper::glDetachShader(&_program->super_CallLogWrapper,notAProgram,notAProgram);
  NegativeTestContext::expectError(_program,0x502);
  glu::CallLogWrapper::glDetachShader(&_program->super_CallLogWrapper,notAShader,notAProgram);
  NegativeTestContext::expectError(_program,0x502);
  NegativeTestContext::endSection(_program);
  pNVar1 = _program;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,
             "GL_INVALID_OPERATION is generated if shader is not attached to program.",&local_c9);
  NegativeTestContext::beginSection(pNVar1,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  glu::CallLogWrapper::glDetachShader(&_program->super_CallLogWrapper,notAProgram,notAShader);
  NegativeTestContext::expectError(_program,0x502);
  NegativeTestContext::endSection(_program);
  glu::CallLogWrapper::glDeleteProgram(&_program->super_CallLogWrapper,notAProgram);
  glu::CallLogWrapper::glDeleteShader(&_program->super_CallLogWrapper,notAShader);
  return;
}

Assistant:

void detach_shader (NegativeTestContext& ctx)
{
	GLuint shader = ctx.glCreateShader(GL_VERTEX_SHADER);
	GLuint program = ctx.glCreateProgram();

	const GLuint notAShader = ctx.glCreateShader(GL_VERTEX_SHADER);
	const GLuint notAProgram = ctx.glCreateProgram();

	ctx.glDeleteShader(notAShader);
	ctx.glDeleteProgram(notAProgram);

	ctx.beginSection("GL_INVALID_VALUE is generated if either program or shader is not a value generated by OpenGL.");
	ctx.glDetachShader(notAProgram, shader);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glDetachShader(program, notAShader);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glDetachShader(notAProgram, notAShader);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if program is not a program object.");
	ctx.glDetachShader(shader, shader);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if shader is not a shader object.");
	ctx.glDetachShader(program, program);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glDetachShader(shader, program);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if shader is not attached to program.");
	ctx.glDetachShader(program, shader);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.glDeleteProgram(program);
	ctx.glDeleteShader(shader);
}